

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  MessageBuilder builder;
  string local_230;
  SourceLineInfo local_210;
  undefined1 local_200 [56];
  _Alloc_hider local_1c8;
  char local_1b8 [24];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_00161480;
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  sVar9 = (_totals->assertions).passed;
  uVar3 = *(undefined4 *)((long)&(_totals->assertions).passed + 4);
  sVar10 = (_totals->assertions).failed;
  uVar4 = *(undefined4 *)((long)&(_totals->assertions).failed + 4);
  sVar11 = (_totals->assertions).failedButOk;
  uVar5 = *(undefined4 *)((long)&(_totals->assertions).failedButOk + 4);
  sVar12 = (_totals->testCases).passed;
  uVar6 = *(undefined4 *)((long)&(_totals->testCases).passed + 4);
  uVar7 = *(undefined4 *)((long)&(_totals->testCases).failed + 4);
  sVar13 = (_totals->testCases).failedButOk;
  uVar8 = *(undefined4 *)((long)&(_totals->testCases).failedButOk + 4);
  *(int *)&(this->totals).testCases.failed = (int)(_totals->testCases).failed;
  *(undefined4 *)((long)&(this->totals).testCases.failed + 4) = uVar7;
  *(int *)&(this->totals).testCases.failedButOk = (int)sVar13;
  *(undefined4 *)((long)&(this->totals).testCases.failedButOk + 4) = uVar8;
  *(int *)&(this->totals).assertions.failedButOk = (int)sVar11;
  *(undefined4 *)((long)&(this->totals).assertions.failedButOk + 4) = uVar5;
  *(int *)&(this->totals).testCases.passed = (int)sVar12;
  *(undefined4 *)((long)&(this->totals).testCases.passed + 4) = uVar6;
  *(int *)&(this->totals).assertions.passed = (int)sVar9;
  *(undefined4 *)((long)&(this->totals).assertions.passed + 4) = uVar3;
  *(int *)&(this->totals).assertions.failed = (int)sVar10;
  *(undefined4 *)((long)&(this->totals).assertions.failed + 4) = uVar4;
  if ((this->assertionResult).m_resultData.message._M_string_length != 0) {
    paVar1 = &local_230.field_2;
    pcVar2 = (this->assertionResult).m_info.macroName._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,
               pcVar2 + (this->assertionResult).m_info.macroName._M_string_length);
    local_210.file = (this->assertionResult).m_info.lineInfo.file;
    local_210.line = (this->assertionResult).m_info.lineInfo.line;
    MessageBuilder::MessageBuilder
              ((MessageBuilder *)local_200,&local_230,&local_210,
               (this->assertionResult).m_resultData.resultType);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    pcVar2 = (this->assertionResult).m_resultData.message._M_dataplus._M_p;
    local_230._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_230,pcVar2,
               pcVar2 + (this->assertionResult).m_resultData.message._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a0,local_230._M_dataplus._M_p,local_230._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    if (local_1c8._M_p != local_1b8) {
      operator_delete(local_1c8._M_p);
    }
    if ((undefined1 *)local_200._0_8_ != local_200 + 0x10) {
      operator_delete((void *)local_200._0_8_);
    }
  }
  return;
}

Assistant:

AssertionStats( AssertionResult const& _assertionResult,
                        std::vector<MessageInfo> const& _infoMessages,
                        Totals const& _totals )
        :   assertionResult( _assertionResult ),
            infoMessages( _infoMessages ),
            totals( _totals )
        {
            if( assertionResult.hasMessage() ) {
                // Copy message into messages list.
                // !TBD This should have been done earlier, somewhere
                MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
                builder << assertionResult.getMessage();
                builder.m_info.message = builder.m_stream.str();

                infoMessages.push_back( builder.m_info );
            }
        }